

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O0

int __thiscall
de::BlockBuffer<unsigned_char>::readFromCurrentBlock
          (BlockBuffer<unsigned_char> *this,int numElements,uchar *elements,bool blocking)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uchar *puVar4;
  deBool dVar5;
  int iVar6;
  BufferCanceledException *this_00;
  int local_54;
  int ndx;
  int numToRead;
  int numUsedInBlock;
  uchar *block;
  bool blocking_local;
  uchar *elements_local;
  int numElements_local;
  BlockBuffer<unsigned_char> *this_local;
  
  if (this->m_readPos == 0) {
    if (blocking) {
      deSemaphore_decrement(this->m_fill);
    }
    else {
      dVar5 = deSemaphore_tryDecrement(this->m_fill);
      if (dVar5 == 0) {
        return 0;
      }
    }
    if (this->m_canceled != 0) {
      deSemaphore_increment(this->m_fill);
      Mutex::unlock(&this->m_readLock);
      this_00 = (BufferCanceledException *)__cxa_allocate_exception(8);
      BufferCanceledException::BufferCanceledException(this_00);
      __cxa_throw(this_00,&BufferCanceledException::typeinfo,
                  BufferCanceledException::~BufferCanceledException);
    }
  }
  puVar4 = this->m_elements;
  iVar1 = this->m_readBlock;
  iVar2 = this->m_blockSize;
  iVar3 = this->m_numUsedInBlock[this->m_readBlock];
  iVar6 = min<int>(numElements,iVar3 - this->m_readPos);
  for (local_54 = 0; local_54 < iVar6; local_54 = local_54 + 1) {
    elements[local_54] = puVar4[(long)(this->m_readPos + local_54) + (long)(iVar1 * iVar2)];
  }
  this->m_readPos = iVar6 + this->m_readPos;
  if (this->m_readPos == iVar3) {
    this->m_readBlock = (this->m_readBlock + 1) % this->m_numBlocks;
    this->m_readPos = 0;
    deSemaphore_increment(this->m_empty);
  }
  return iVar6;
}

Assistant:

int BlockBuffer<T>::readFromCurrentBlock (int numElements, T* elements, bool blocking)
{
	DE_ASSERT(numElements > 0 && elements != DE_NULL);

	if (m_readPos == 0)
	{
		/* Read thread doesn't own current block - need to acquire. */
		if (blocking)
			deSemaphore_decrement(m_fill);
		else
		{
			if (!deSemaphore_tryDecrement(m_fill))
				return 0;
		}

		/* Check for canceled bit. */
		if (m_canceled)
		{
			// \todo [2012-07-06 pyry] A bit hackish to assume that read lock is not freed if exception is thrown out here.
			deSemaphore_increment(m_fill);
			m_readLock.unlock();
			throw CanceledException();
		}
	}

	/* Read thread now owns current block. */
	const T*	block			= m_elements + m_readBlock*m_blockSize;
	int			numUsedInBlock	= m_numUsedInBlock[m_readBlock];
	int			numToRead		= de::min(numElements, numUsedInBlock-m_readPos);

	DE_ASSERT(numToRead > 0);

	for (int ndx = 0; ndx < numToRead; ndx++)
		elements[ndx] = block[m_readPos+ndx];

	m_readPos += numToRead;

	if (m_readPos == numUsedInBlock)
	{
		/* Free current read block and advance. */
		m_readBlock		= (m_readBlock+1) % m_numBlocks;
		m_readPos		= 0;
		deSemaphore_increment(m_empty);
	}

	return numToRead;
}